

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

string * __thiscall
cmSourceFile::GetLanguage_abi_cxx11_(string *__return_storage_ptr__,cmSourceFile *this)

{
  bool bVar1;
  string *psVar2;
  cmValue local_20;
  cmValue lang;
  cmSourceFile *this_local;
  
  lang.Value = (string *)this;
  local_20 = GetProperty(this,&propLANGUAGE_abi_cxx11_);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_20);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Language);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSourceFile::GetLanguage() const
{
  // If the language was set explicitly by the user then use it.
  if (cmValue lang = this->GetProperty(propLANGUAGE)) {
    return *lang;
  }

  // Use the language determined from the file extension.
  return this->Language;
}